

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol.cc
# Opt level: O1

pair<client_message,_bool> *
client_message::from(pair<client_message,_bool> *__return_storage_ptr__,char *stream,size_t len)

{
  long lVar1;
  char *__function;
  size_t len_00;
  ulong *puVar2;
  pair<client_message,_bool> *ppVar3;
  ulong uVar4;
  bool bVar5;
  byte bVar6;
  uint8_t *pointer;
  client_message msg;
  byte *local_70;
  ulong local_68;
  byte local_60;
  uint local_5c;
  byte local_58 [64];
  
  bVar6 = 0;
  if (len < 0xf) {
LAB_00108b1e:
    (__return_storage_ptr__->first).player_name[0x30] = '\0';
    (__return_storage_ptr__->first).player_name[0x31] = '\0';
    (__return_storage_ptr__->first).player_name[0x32] = '\0';
    (__return_storage_ptr__->first).player_name[0x33] = '\0';
    (__return_storage_ptr__->first).player_name[0x34] = '\0';
    (__return_storage_ptr__->first).player_name[0x35] = '\0';
    (__return_storage_ptr__->first).player_name[0x36] = '\0';
    (__return_storage_ptr__->first).player_name[0x37] = '\0';
    (__return_storage_ptr__->first).player_name[0x38] = '\0';
    (__return_storage_ptr__->first).player_name[0x39] = '\0';
    (__return_storage_ptr__->first).player_name[0x3a] = '\0';
    (__return_storage_ptr__->first).player_name[0x3b] = '\0';
    (__return_storage_ptr__->first).player_name[0x3c] = '\0';
    (__return_storage_ptr__->first).player_name[0x3d] = '\0';
    (__return_storage_ptr__->first).player_name[0x3e] = '\0';
    (__return_storage_ptr__->first).player_name[0x3f] = '\0';
    (__return_storage_ptr__->first).player_name[0x20] = '\0';
    (__return_storage_ptr__->first).player_name[0x21] = '\0';
    (__return_storage_ptr__->first).player_name[0x22] = '\0';
    (__return_storage_ptr__->first).player_name[0x23] = '\0';
    (__return_storage_ptr__->first).player_name[0x24] = '\0';
    (__return_storage_ptr__->first).player_name[0x25] = '\0';
    (__return_storage_ptr__->first).player_name[0x26] = '\0';
    (__return_storage_ptr__->first).player_name[0x27] = '\0';
    (__return_storage_ptr__->first).player_name[0x28] = '\0';
    (__return_storage_ptr__->first).player_name[0x29] = '\0';
    (__return_storage_ptr__->first).player_name[0x2a] = '\0';
    (__return_storage_ptr__->first).player_name[0x2b] = '\0';
    (__return_storage_ptr__->first).player_name[0x2c] = '\0';
    (__return_storage_ptr__->first).player_name[0x2d] = '\0';
    (__return_storage_ptr__->first).player_name[0x2e] = '\0';
    (__return_storage_ptr__->first).player_name[0x2f] = '\0';
    (__return_storage_ptr__->first).player_name[0x10] = '\0';
    (__return_storage_ptr__->first).player_name[0x11] = '\0';
    (__return_storage_ptr__->first).player_name[0x12] = '\0';
    (__return_storage_ptr__->first).player_name[0x13] = '\0';
    (__return_storage_ptr__->first).player_name[0x14] = '\0';
    (__return_storage_ptr__->first).player_name[0x15] = '\0';
    (__return_storage_ptr__->first).player_name[0x16] = '\0';
    (__return_storage_ptr__->first).player_name[0x17] = '\0';
    (__return_storage_ptr__->first).player_name[0x18] = '\0';
    (__return_storage_ptr__->first).player_name[0x19] = '\0';
    (__return_storage_ptr__->first).player_name[0x1a] = '\0';
    (__return_storage_ptr__->first).player_name[0x1b] = '\0';
    (__return_storage_ptr__->first).player_name[0x1c] = '\0';
    (__return_storage_ptr__->first).player_name[0x1d] = '\0';
    (__return_storage_ptr__->first).player_name[0x1e] = '\0';
    (__return_storage_ptr__->first).player_name[0x1f] = '\0';
    (__return_storage_ptr__->first).player_name[0] = '\0';
    (__return_storage_ptr__->first).player_name[1] = '\0';
    (__return_storage_ptr__->first).player_name[2] = '\0';
    (__return_storage_ptr__->first).player_name[3] = '\0';
    (__return_storage_ptr__->first).player_name[4] = '\0';
    (__return_storage_ptr__->first).player_name[5] = '\0';
    (__return_storage_ptr__->first).player_name[6] = '\0';
    (__return_storage_ptr__->first).player_name[7] = '\0';
    (__return_storage_ptr__->first).player_name[8] = '\0';
    (__return_storage_ptr__->first).player_name[9] = '\0';
    (__return_storage_ptr__->first).player_name[10] = '\0';
    (__return_storage_ptr__->first).player_name[0xb] = '\0';
    (__return_storage_ptr__->first).player_name[0xc] = '\0';
    (__return_storage_ptr__->first).player_name[0xd] = '\0';
    (__return_storage_ptr__->first).player_name[0xe] = '\0';
    (__return_storage_ptr__->first).player_name[0xf] = '\0';
    (__return_storage_ptr__->first).session_id = 0;
    (__return_storage_ptr__->first).turn_direction = '\0';
    *(undefined3 *)&(__return_storage_ptr__->first).field_0x9 = 0;
    (__return_storage_ptr__->first).next_expected_event = 0;
    __return_storage_ptr__->second = false;
    return __return_storage_ptr__;
  }
  local_58[0x30] = 0;
  local_58[0x31] = 0;
  local_58[0x32] = 0;
  local_58[0x33] = 0;
  local_58[0x34] = 0;
  local_58[0x35] = 0;
  local_58[0x36] = 0;
  local_58[0x37] = 0;
  local_58[0x38] = 0;
  local_58[0x39] = 0;
  local_58[0x3a] = 0;
  local_58[0x3b] = 0;
  local_58[0x3c] = 0;
  local_58[0x3d] = 0;
  local_58[0x3e] = 0;
  local_58[0x3f] = 0;
  local_58[0x20] = 0;
  local_58[0x21] = 0;
  local_58[0x22] = 0;
  local_58[0x23] = 0;
  local_58[0x24] = 0;
  local_58[0x25] = 0;
  local_58[0x26] = 0;
  local_58[0x27] = 0;
  local_58[0x28] = 0;
  local_58[0x29] = 0;
  local_58[0x2a] = 0;
  local_58[0x2b] = 0;
  local_58[0x2c] = 0;
  local_58[0x2d] = 0;
  local_58[0x2e] = 0;
  local_58[0x2f] = 0;
  local_58[0x10] = 0;
  local_58[0x11] = 0;
  local_58[0x12] = 0;
  local_58[0x13] = 0;
  local_58[0x14] = 0;
  local_58[0x15] = 0;
  local_58[0x16] = 0;
  local_58[0x17] = 0;
  local_58[0x18] = 0;
  local_58[0x19] = 0;
  local_58[0x1a] = 0;
  local_58[0x1b] = 0;
  local_58[0x1c] = 0;
  local_58[0x1d] = 0;
  local_58[0x1e] = 0;
  local_58[0x1f] = 0;
  local_58[0] = 0;
  local_58[1] = 0;
  local_58[2] = 0;
  local_58[3] = 0;
  local_58[4] = 0;
  local_58[5] = 0;
  local_58[6] = 0;
  local_58[7] = 0;
  local_58[8] = 0;
  local_58[9] = 0;
  local_58[10] = 0;
  local_58[0xb] = 0;
  local_58[0xc] = 0;
  local_58[0xd] = 0;
  local_58[0xe] = 0;
  local_58[0xf] = 0;
  local_70 = (byte *)stream;
  if ((long)len < 1) {
    __function = 
    "bool (anonymous namespace)::consume_bytes(const std::uint8_t *, size_t, const std::uint8_t *&, T &) [T = unsigned long]"
    ;
  }
  else {
    if (7 < (long)len) {
      local_70 = (byte *)(stream + 8);
      uVar4 = *(ulong *)stream;
      local_68 = uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 |
                 (uVar4 & 0xff0000000000) >> 0x18 | (uVar4 & 0xff00000000) >> 8 |
                 (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 | (uVar4 & 0xff00) << 0x28 |
                 uVar4 << 0x38;
    }
    if ((stream <= local_70) && (local_70 < stream + len)) {
      if (local_70 + 1 <= stream + len) {
        local_60 = *local_70;
        local_70 = local_70 + 1;
      }
      anon_unknown.dwarf_359a2::consume_bytes<unsigned_int>
                ((uint8_t *)stream,len,&local_70,&local_5c);
      if ((byte)((local_60 ^ (char)local_60 >> 7) - ((char)local_60 >> 7)) < 2) {
        uVar4 = len - 0xd;
        len_00 = 0x40;
        if (uVar4 < 0x40) {
          len_00 = uVar4;
        }
        if (uVar4 != 0) {
          lVar1 = 0;
          do {
            local_58[lVar1] = local_70[lVar1];
            if (local_70[lVar1] == 0) break;
            bVar5 = (len_00 - 1) + (ulong)(len_00 == 0) != lVar1;
            lVar1 = lVar1 + 1;
          } while (bVar5);
        }
        bVar5 = util::is_valid_player_name((char *)local_58,len_00,true);
        if (bVar5) {
          puVar2 = &local_68;
          ppVar3 = __return_storage_ptr__;
          for (lVar1 = 10; lVar1 != 0; lVar1 = lVar1 + -1) {
            (ppVar3->first).session_id = *puVar2;
            puVar2 = puVar2 + (ulong)bVar6 * -2 + 1;
            ppVar3 = (pair<client_message,_bool> *)((long)ppVar3 + (ulong)bVar6 * -0x10 + 8);
          }
          __return_storage_ptr__->second = true;
          return __return_storage_ptr__;
        }
      }
      goto LAB_00108b1e;
    }
    __function = 
    "bool (anonymous namespace)::consume_bytes(const std::uint8_t *, size_t, const std::uint8_t *&, T &) [T = signed char]"
    ;
  }
  __assert_fail("len == 0 || (pointer >= stream && pointer < stream + len)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Xanewok[P]netacka-clone/protocol.cc"
                ,0x2e,__function);
}

Assistant:

std::pair<client_message, bool> client_message::from(const char* stream, size_t len)
{
	constexpr int MIN_MESSAGE_LEN = sizeof(client_message::session_id)
		+ sizeof(client_message::turn_direction)
		+ sizeof(client_message::next_expected_event) + sizeof('\0');

	if (len <= MIN_MESSAGE_LEN)
		return std::make_pair(client_message(), false);

	client_message msg;

	const uint8_t* data = reinterpret_cast<const std::uint8_t*>(stream);
	const uint8_t* pointer = data;
	consume_bytes(data, len, pointer, msg.session_id);
	consume_bytes(data, len, pointer, msg.turn_direction);
	consume_bytes(data, len, pointer, msg.next_expected_event);

	// Only { -1, 0, 1 } are valid turn_directions
	if (std::abs(msg.turn_direction) > 1)
		return std::make_pair(client_message(), false);

	const size_t name_len = std::min(len - MIN_MESSAGE_LEN + 1, sizeof(msg.player_name));
	for (size_t i = 0; i < name_len; ++i)
	{
		msg.player_name[i] = pointer[i];
		if (pointer[i] == '\0')
			break;
	}

	if (!util::is_valid_player_name(msg.player_name, name_len))
		return std::make_pair(client_message(), false);

	return std::make_pair(msg, true);
}